

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O3

string * __thiscall
Memory::get_flipped_rows_text_repr_abi_cxx11_(string *__return_storage_ptr__,Memory *this)

{
  pointer pBVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  _Base_ptr p_Var5;
  BitFlip *da;
  pointer pBVar6;
  stringstream local_1f0 [8];
  stringstream ss;
  undefined1 local_1e0 [376];
  undefined1 local_68 [8];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> flipped_rows;
  
  flipped_rows._M_t._M_impl._0_4_ = 0;
  flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  pBVar6 = (this->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1 = (this->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
           super__Vector_impl_data._M_finish;
  flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Rb_tree_node_base *)&flipped_rows;
  flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Rb_tree_node_base *)&flipped_rows;
  flipped_rows._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)__return_storage_ptr__;
  if (pBVar6 != pBVar1) {
    do {
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)local_68,&(pBVar6->address).row);
      pBVar6 = pBVar6 + 1;
    } while (pBVar6 != pBVar1);
  }
  std::__cxx11::stringstream::stringstream(local_1f0);
  if (flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Rb_tree_node_base *)&flipped_rows) {
    p_Var5 = flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)local_1e0);
      lVar2 = *(long *)(p_Var5 + 1);
      lVar4 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&flipped_rows);
      if (lVar2 != *(long *)(lVar4 + 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,",",1);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != (_Rb_tree_node_base *)&flipped_rows);
  }
  sVar3 = flipped_rows._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1f0);
  std::ios_base::~ios_base((ios_base *)(local_1e0 + 0x70));
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)local_68);
  return (string *)sVar3;
}

Assistant:

std::string Memory::get_flipped_rows_text_repr() {
  // first extract all rows, otherwise it will not be possible to know in advance whether we we still
  // need to add a separator (comma) to the string as upcoming DRAMAddr instances might refer to the same row
  std::set<size_t> flipped_rows;
  for (const auto &da : flipped_bits) {
    flipped_rows.insert(da.address.row);
  }

  std::stringstream ss;
  for (const auto &row : flipped_rows) {
    ss << row;
    if (row!=*flipped_rows.rbegin()) ss << ",";
  }
  return ss.str();
}